

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O2

void __thiscall CTestNet4Params::CTestNet4Params(CTestNet4Params *this)

{
  uint256 *puVar1;
  CBlock *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  long lVar2;
  pointer puVar3;
  base_blob<256U> *pbVar4;
  bool bVar5;
  CScript *this_02;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  long in_FS_OFFSET;
  initializer_list<std::pair<const_int,_uint256>_> __l;
  CAmount *in_stack_ffffffffffffff20;
  undefined1 local_d8 [16];
  pointer local_c8;
  uchar auStack_c0 [24];
  undefined1 local_a8 [24];
  _Base_ptr p_Stack_90;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_58;
  CScript testnet4_genesis_script;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::CChainParams(&this->super_CChainParams);
  (this->super_CChainParams).m_chain_type = TESTNET4;
  (this->super_CChainParams).consensus.signet_blocks = false;
  puVar3 = (this->super_CChainParams).consensus.signet_challenge.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_CChainParams).consensus.signet_challenge.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->super_CChainParams).consensus.signet_challenge.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  (this->super_CChainParams).consensus.nSubsidyHalvingInterval = 210000;
  (this->super_CChainParams).consensus.BIP34Height = 1;
  puVar1 = &(this->super_CChainParams).consensus.BIP34Hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar4 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[8] = '\0';
  (pbVar4->m_data)._M_elems[9] = '\0';
  (pbVar4->m_data)._M_elems[10] = '\0';
  (pbVar4->m_data)._M_elems[0xb] = '\0';
  (pbVar4->m_data)._M_elems[0xc] = '\0';
  (pbVar4->m_data)._M_elems[0xd] = '\0';
  (pbVar4->m_data)._M_elems[0xe] = '\0';
  (pbVar4->m_data)._M_elems[0xf] = '\0';
  pbVar4 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x10] = '\0';
  (pbVar4->m_data)._M_elems[0x11] = '\0';
  (pbVar4->m_data)._M_elems[0x12] = '\0';
  (pbVar4->m_data)._M_elems[0x13] = '\0';
  (pbVar4->m_data)._M_elems[0x14] = '\0';
  (pbVar4->m_data)._M_elems[0x15] = '\0';
  (pbVar4->m_data)._M_elems[0x16] = '\0';
  (pbVar4->m_data)._M_elems[0x17] = '\0';
  pbVar4 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x18] = '\0';
  (pbVar4->m_data)._M_elems[0x19] = '\0';
  (pbVar4->m_data)._M_elems[0x1a] = '\0';
  (pbVar4->m_data)._M_elems[0x1b] = '\0';
  (pbVar4->m_data)._M_elems[0x1c] = '\0';
  (pbVar4->m_data)._M_elems[0x1d] = '\0';
  (pbVar4->m_data)._M_elems[0x1e] = '\0';
  (pbVar4->m_data)._M_elems[0x1f] = '\0';
  (this->super_CChainParams).consensus.BIP65Height = 1;
  (this->super_CChainParams).consensus.BIP66Height = 1;
  (this->super_CChainParams).consensus.CSVHeight = 1;
  (this->super_CChainParams).consensus.SegwitHeight = 1;
  (this->super_CChainParams).consensus.MinBIP9WarningHeight = 0;
  puVar1 = &(this->super_CChainParams).consensus.powLimit;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0xff;
  pbVar4 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[4] = 0xff;
  (pbVar4->m_data)._M_elems[5] = 0xff;
  (pbVar4->m_data)._M_elems[6] = 0xff;
  (pbVar4->m_data)._M_elems[7] = 0xff;
  pbVar4 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[8] = 0xff;
  (pbVar4->m_data)._M_elems[9] = 0xff;
  (pbVar4->m_data)._M_elems[10] = 0xff;
  (pbVar4->m_data)._M_elems[0xb] = 0xff;
  pbVar4 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0xc] = 0xff;
  (pbVar4->m_data)._M_elems[0xd] = 0xff;
  (pbVar4->m_data)._M_elems[0xe] = 0xff;
  (pbVar4->m_data)._M_elems[0xf] = 0xff;
  pbVar4 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0xc] = 0xff;
  (pbVar4->m_data)._M_elems[0xd] = 0xff;
  (pbVar4->m_data)._M_elems[0xe] = 0xff;
  (pbVar4->m_data)._M_elems[0xf] = 0xff;
  pbVar4 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x10] = 0xff;
  (pbVar4->m_data)._M_elems[0x11] = 0xff;
  (pbVar4->m_data)._M_elems[0x12] = 0xff;
  (pbVar4->m_data)._M_elems[0x13] = 0xff;
  pbVar4 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x14] = 0xff;
  (pbVar4->m_data)._M_elems[0x15] = 0xff;
  (pbVar4->m_data)._M_elems[0x16] = 0xff;
  (pbVar4->m_data)._M_elems[0x17] = 0xff;
  pbVar4 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x18] = 0xff;
  (pbVar4->m_data)._M_elems[0x19] = 0xff;
  (pbVar4->m_data)._M_elems[0x1a] = 0xff;
  (pbVar4->m_data)._M_elems[0x1b] = 0xff;
  pbVar4 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x1c] = '\0';
  (pbVar4->m_data)._M_elems[0x1d] = '\0';
  (pbVar4->m_data)._M_elems[0x1e] = '\0';
  (pbVar4->m_data)._M_elems[0x1f] = '\0';
  (this->super_CChainParams).consensus.nPowTargetTimespan = 0x127500;
  (this->super_CChainParams).consensus.nPowTargetSpacing = 600;
  (this->super_CChainParams).consensus.fPowAllowMinDifficultyBlocks = true;
  (this->super_CChainParams).consensus.enforce_BIP94 = true;
  (this->super_CChainParams).consensus.fPowNoRetargeting = false;
  (this->super_CChainParams).consensus.nRuleChangeActivationThreshold = 0x5e8;
  (this->super_CChainParams).consensus.nMinerConfirmationWindow = 0x7e0;
  (this->super_CChainParams).consensus.vDeployments[0].bit = 0x1c;
  (this->super_CChainParams).consensus.vDeployments[0].nStartTime = -2;
  (this->super_CChainParams).consensus.vDeployments[0].nTimeout = 0x7fffffffffffffff;
  (this->super_CChainParams).consensus.vDeployments[0].min_activation_height = 0;
  (this->super_CChainParams).consensus.vDeployments[1].bit = 2;
  (this->super_CChainParams).consensus.vDeployments[1].nStartTime = -1;
  (this->super_CChainParams).consensus.vDeployments[1].nTimeout = 0x7fffffffffffffff;
  (this->super_CChainParams).consensus.vDeployments[1].min_activation_height = 0;
  puVar1 = &(this->super_CChainParams).consensus.nMinimumChainWork;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xba;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0xf3;
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\x02';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 'b';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '.';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = 0xd0;
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\x15';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = 0xaa;
  (this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>.m_data._M_elems[8] =
       '_';
  pbVar4 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[9] = '\0';
  (pbVar4->m_data)._M_elems[10] = '\0';
  (pbVar4->m_data)._M_elems[0xb] = '\0';
  (pbVar4->m_data)._M_elems[0xc] = '\0';
  (pbVar4->m_data)._M_elems[0xd] = '\0';
  (pbVar4->m_data)._M_elems[0xe] = '\0';
  (pbVar4->m_data)._M_elems[0xf] = '\0';
  (pbVar4->m_data)._M_elems[0x10] = '\0';
  pbVar4 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x11] = '\0';
  (pbVar4->m_data)._M_elems[0x12] = '\0';
  (pbVar4->m_data)._M_elems[0x13] = '\0';
  (pbVar4->m_data)._M_elems[0x14] = '\0';
  (pbVar4->m_data)._M_elems[0x15] = '\0';
  (pbVar4->m_data)._M_elems[0x16] = '\0';
  (pbVar4->m_data)._M_elems[0x17] = '\0';
  (pbVar4->m_data)._M_elems[0x18] = '\0';
  pbVar4 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x18] = '\0';
  (pbVar4->m_data)._M_elems[0x19] = '\0';
  (pbVar4->m_data)._M_elems[0x1a] = '\0';
  (pbVar4->m_data)._M_elems[0x1b] = '\0';
  (pbVar4->m_data)._M_elems[0x1c] = '\0';
  (pbVar4->m_data)._M_elems[0x1d] = '\0';
  (pbVar4->m_data)._M_elems[0x1e] = '\0';
  (pbVar4->m_data)._M_elems[0x1f] = '\0';
  puVar1 = &(this->super_CChainParams).consensus.defaultAssumeValid;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xfd;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0x81;
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xf6;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0xb6;
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = 't';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = 0xb3;
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = 0x8d;
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\x1a';
  pbVar4 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[8] = '9';
  (pbVar4->m_data)._M_elems[9] = '\x11';
  (pbVar4->m_data)._M_elems[10] = 0xb3;
  (pbVar4->m_data)._M_elems[0xb] = 0xcf;
  (pbVar4->m_data)._M_elems[0xc] = 'g';
  (pbVar4->m_data)._M_elems[0xd] = 0xb6;
  (pbVar4->m_data)._M_elems[0xe] = 0x95;
  (pbVar4->m_data)._M_elems[0xf] = 'F';
  pbVar4 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x10] = '|';
  (pbVar4->m_data)._M_elems[0x11] = 0xfe;
  (pbVar4->m_data)._M_elems[0x12] = 0x89;
  (pbVar4->m_data)._M_elems[0x13] = ']';
  (pbVar4->m_data)._M_elems[0x14] = 0xfa;
  (pbVar4->m_data)._M_elems[0x15] = 0x91;
  (pbVar4->m_data)._M_elems[0x16] = 0xb9;
  (pbVar4->m_data)._M_elems[0x17] = '}';
  pbVar4 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x18] = '\x05';
  (pbVar4->m_data)._M_elems[0x19] = 'H';
  (pbVar4->m_data)._M_elems[0x1a] = 0xe3;
  (pbVar4->m_data)._M_elems[0x1b] = '[';
  pbVar4 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar4->m_data)._M_elems[0x1c] = '\0';
  (pbVar4->m_data)._M_elems[0x1d] = '\0';
  (pbVar4->m_data)._M_elems[0x1e] = '\0';
  (pbVar4->m_data)._M_elems[0x1f] = '\0';
  *(undefined4 *)(this->super_CChainParams).pchMessageStart._M_elems = 0x283f161c;
  (this->super_CChainParams).nDefaultPort = 0xbccd;
  (this->super_CChainParams).nPruneAfterHeight = 1000;
  (this->super_CChainParams).m_assumed_blockchain_size = 1;
  (this->super_CChainParams).m_assumed_chain_state_size = 0;
  local_a8._16_8_ = 0;
  p_Stack_90 = (_Base_ptr)0x0;
  local_a8._0_8_ = (char *)0x0;
  local_a8._8_8_ = 0;
  util::hex_literals::
  operator___hex_v_u8<util::hex_literals::detail::Hex<67UL>___0,_0,_0,_0,_0,_0,_0,_0,_0,_0,_______>
            ();
  this_02 = CScript::operator<<((CScript *)local_a8,
                                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
  other = &CScript::operator<<(this_02,OP_CHECKSIG)->super_CScriptBase;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&testnet4_genesis_script.super_CScriptBase,other);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_a8);
  local_d8._0_8_ = (pointer)0x12a05f200;
  CreateGenesisBlock((CBlock *)local_a8,
                     "03/May/2024 000000000000000000001ebd58c244970b3aa9d783bb001011fbe8ea8e98e00e",
                     &testnet4_genesis_script,0x66356f04,0x17780cbb,0x1d00ffff,
                     (int32_t)(_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                              local_d8,in_stack_ffffffffffffff20);
  this_00 = &(this->super_CChainParams).genesis;
  CBlock::operator=(this_00,(CBlock *)local_a8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_58);
  CBlockHeader::GetHash((uint256 *)local_a8,&this_00->super_CBlockHeader);
  *(undefined8 *)
   ((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems +
   0x10) = local_a8._16_8_;
  *(_Base_ptr *)
   ((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems +
   0x18) = p_Stack_90;
  *(undefined8 *)
   (this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems =
       local_a8._0_8_;
  *(undefined8 *)
   ((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data._M_elems + 8)
       = local_a8._8_8_;
  local_a8._0_8_ = (char *)0x5be350b0da8bf043;
  local_a8._8_8_ = 0x507ff4914b867c56;
  local_a8._16_8_ = 0xfbbc53dee25a72ae;
  p_Stack_90 = (_Base_ptr)0xda84f2ba;
  bVar5 = ::operator==((base_blob<256U> *)this,(base_blob<256U> *)local_a8);
  if (!bVar5) {
    __assert_fail("consensus.hashGenesisBlock == uint256{\"00000000da84f2bafbbc53dee25a72ae507ff4914b867c565be350b0da8bf043\"}"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x16d,"CTestNet4Params::CTestNet4Params()");
  }
  local_a8._0_8_ = (char *)0x9102fe28912b7b4e;
  local_a8._8_8_ = 0xb718e42aaf9306db;
  local_a8._16_8_ = 0xcb807e40cd57e667;
  p_Stack_90 = (_Base_ptr)0x7aa0a7ae1e223414;
  bVar5 = ::operator==(&(this->super_CChainParams).genesis.super_CBlockHeader.hashMerkleRoot.
                        super_base_blob<256U>,(base_blob<256U> *)local_a8);
  if (!bVar5) {
    __assert_fail("genesis.hashMerkleRoot == uint256{\"7aa0a7ae1e223414cb807e40cd57e667b718e42aaf9306db9102fe28912b7b4e\"}"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x16e,"CTestNet4Params::CTestNet4Params()");
  }
  puVar3 = (this->super_CChainParams).vFixedSeeds.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_CChainParams).vFixedSeeds.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (this->super_CChainParams).vFixedSeeds.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  this_01 = &(this->super_CChainParams).vSeeds;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_01);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[36]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [36])"seed.testnet4.bitcoin.sprovoost.nl.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[23]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [23])"seed.testnet4.wiz.biz.");
  local_d8[0] = (allocator_type)0x6f;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8,1,local_d8,
             (allocator_type *)&stack0xffffffffffffff27);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes,
             (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
  local_d8[0] = (allocator_type)0xc4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8,1,local_d8,
             (allocator_type *)&stack0xffffffffffffff27);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes + 1,
             (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
  local_d8[0] = (allocator_type)0xef;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8,1,local_d8,
             (allocator_type *)&stack0xffffffffffffff27);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes + 2,
             (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
  local_a8._0_4_ = 0xcf873504;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 3),local_a8,local_a8 + 4);
  local_a8._0_4_ = 0x94833504;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 4),local_a8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&(this->super_CChainParams).bech32_hrp,"tb");
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_a8,
             chainparams_seed_testnet4,"",(allocator_type *)local_d8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&(this->super_CChainParams).vFixedSeeds,
             (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
  (this->super_CChainParams).fDefaultConsistencyChecks = false;
  (this->super_CChainParams).m_is_mockable_chain = false;
  local_c8 = (pointer)0x0;
  auStack_c0[0] = '\0';
  auStack_c0[1] = '\0';
  auStack_c0[2] = '\0';
  auStack_c0[3] = '\0';
  auStack_c0[4] = '\0';
  auStack_c0[5] = '\0';
  auStack_c0[6] = '\0';
  auStack_c0[7] = '\0';
  local_d8._0_8_ = (pointer)0x0;
  local_d8._8_8_ = (pointer)0x0;
  auStack_c0[8] = '\0';
  auStack_c0[9] = '\0';
  auStack_c0[10] = '\0';
  auStack_c0[0xb] = '\0';
  __l._M_len = 1;
  __l._M_array = (iterator)local_d8;
  std::map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>::map
            ((map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_> *)
             local_a8,__l,(less<int> *)&stack0xffffffffffffff27,
             (allocator_type *)&stack0xffffffffffffff26);
  std::
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  ::operator=((_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
               *)&(this->super_CChainParams).checkpointData,
              (_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
               *)local_a8);
  std::
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
               *)local_a8);
  std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>::vector
            ((vector<AssumeutxoData,_std::allocator<AssumeutxoData>_> *)local_a8,
             (initializer_list<AssumeutxoData>)ZEXT816(0),(allocator_type *)local_d8);
  std::vector<AssumeutxoData,_std::allocator<AssumeutxoData>_>::_M_move_assign
            (&(this->super_CChainParams).m_assumeutxo_data,
             (_Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_> *)local_a8);
  std::_Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>::~_Vector_base
            ((_Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_> *)local_a8);
  (this->super_CChainParams).chainTxData.nTime = 0x66bcd676;
  (this->super_CChainParams).chainTxData.tx_count = 0xb8ded;
  (this->super_CChainParams).chainTxData.dTxRate = 0.01570402633472492;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&testnet4_genesis_script.super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTestNet4Params() {
        m_chain_type = ChainType::TESTNET4;
        consensus.signet_blocks = false;
        consensus.signet_challenge.clear();
        consensus.nSubsidyHalvingInterval = 210000;
        consensus.BIP34Height = 1;
        consensus.BIP34Hash = uint256{};
        consensus.BIP65Height = 1;
        consensus.BIP66Height = 1;
        consensus.CSVHeight = 1;
        consensus.SegwitHeight = 1;
        consensus.MinBIP9WarningHeight = 0;
        consensus.powLimit = uint256{"00000000ffffffffffffffffffffffffffffffffffffffffffffffffffffffff"};
        consensus.nPowTargetTimespan = 14 * 24 * 60 * 60; // two weeks
        consensus.nPowTargetSpacing = 10 * 60;
        consensus.fPowAllowMinDifficultyBlocks = true;
        consensus.enforce_BIP94 = true;
        consensus.fPowNoRetargeting = false;
        consensus.nRuleChangeActivationThreshold = 1512; // 75% for testchains
        consensus.nMinerConfirmationWindow = 2016; // nPowTargetTimespan / nPowTargetSpacing
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].bit = 28;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nStartTime = Consensus::BIP9Deployment::NEVER_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].min_activation_height = 0; // No activation delay

        // Deployment of Taproot (BIPs 340-342)
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].bit = 2;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nStartTime = Consensus::BIP9Deployment::ALWAYS_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].min_activation_height = 0; // No activation delay

        consensus.nMinimumChainWork = uint256{"00000000000000000000000000000000000000000000005faa15d02e6202f3ba"};
        consensus.defaultAssumeValid = uint256{"000000005be348057db991fa5d89fe7c4695b667cfb311391a8db374b6f681fd"}; // 39550

        pchMessageStart[0] = 0x1c;
        pchMessageStart[1] = 0x16;
        pchMessageStart[2] = 0x3f;
        pchMessageStart[3] = 0x28;
        nDefaultPort = 48333;
        nPruneAfterHeight = 1000;
        m_assumed_blockchain_size = 1;
        m_assumed_chain_state_size = 0;

        const char* testnet4_genesis_msg = "03/May/2024 000000000000000000001ebd58c244970b3aa9d783bb001011fbe8ea8e98e00e";
        const CScript testnet4_genesis_script = CScript() << "000000000000000000000000000000000000000000000000000000000000000000"_hex_v_u8 << OP_CHECKSIG;
        genesis = CreateGenesisBlock(testnet4_genesis_msg,
                testnet4_genesis_script,
                1714777860,
                393743547,
                0x1d00ffff,
                1,
                50 * COIN);
        consensus.hashGenesisBlock = genesis.GetHash();
        assert(consensus.hashGenesisBlock == uint256{"00000000da84f2bafbbc53dee25a72ae507ff4914b867c565be350b0da8bf043"});
        assert(genesis.hashMerkleRoot == uint256{"7aa0a7ae1e223414cb807e40cd57e667b718e42aaf9306db9102fe28912b7b4e"});

        vFixedSeeds.clear();
        vSeeds.clear();
        // nodes with support for servicebits filtering should be at the top
        vSeeds.emplace_back("seed.testnet4.bitcoin.sprovoost.nl."); // Sjors Provoost
        vSeeds.emplace_back("seed.testnet4.wiz.biz."); // Jason Maurice

        base58Prefixes[PUBKEY_ADDRESS] = std::vector<unsigned char>(1,111);
        base58Prefixes[SCRIPT_ADDRESS] = std::vector<unsigned char>(1,196);
        base58Prefixes[SECRET_KEY] =     std::vector<unsigned char>(1,239);
        base58Prefixes[EXT_PUBLIC_KEY] = {0x04, 0x35, 0x87, 0xCF};
        base58Prefixes[EXT_SECRET_KEY] = {0x04, 0x35, 0x83, 0x94};

        bech32_hrp = "tb";

        vFixedSeeds = std::vector<uint8_t>(std::begin(chainparams_seed_testnet4), std::end(chainparams_seed_testnet4));

        fDefaultConsistencyChecks = false;
        m_is_mockable_chain = false;

        checkpointData = {
            {
                {},
            }
        };

        m_assumeutxo_data = {
            {}
        };

        chainTxData = ChainTxData{
            // Data from RPC: getchaintxstats 4096 000000005be348057db991fa5d89fe7c4695b667cfb311391a8db374b6f681fd
            .nTime    = 1723651702,
            .tx_count = 757229,
            .dTxRate  = 0.01570402633472492,
        };
    }